

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QGraphicsItemPrivate::ExtraStruct>::moveAppend
          (QGenericArrayOps<QGraphicsItemPrivate::ExtraStruct> *this,ExtraStruct *b,ExtraStruct *e)

{
  qsizetype *pqVar1;
  undefined8 *puVar2;
  ExtraStruct *pEVar3;
  long lVar4;
  PrivateShared *pPVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  if (b != e) {
    pEVar3 = (this->super_QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>).ptr;
    for (; b < e; b = b + 1) {
      lVar4 = (this->super_QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>).size;
      pEVar3[lVar4].type = b->type;
      pPVar5 = (b->value).d.data.shared;
      uVar6 = *(undefined8 *)((long)&(b->value).d.data + 8);
      uVar7 = *(undefined8 *)&(b->value).d.field_0x18;
      puVar2 = (undefined8 *)((long)&pEVar3[lVar4].value.d.data + 0x10);
      *puVar2 = *(undefined8 *)((long)&(b->value).d.data + 0x10);
      puVar2[1] = uVar7;
      pEVar3[lVar4].value.d.data.shared = pPVar5;
      *(undefined8 *)((long)&pEVar3[lVar4].value.d.data + 8) = uVar6;
      (b->value).d.data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(b->value).d.data + 8) = 0;
      *(undefined8 *)((long)&(b->value).d.data + 0x10) = 0;
      *(undefined8 *)&(b->value).d.field_0x18 = 2;
      pqVar1 = &(this->super_QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }